

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  int *piVar1;
  lua_Number n;
  lu_byte lVar2;
  lu_byte lVar3;
  undefined2 uVar4;
  uint asize;
  int iVar5;
  uint uVar6;
  int iVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  TValue *pTVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint ause;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  TValue *io2;
  Node *pNVar19;
  int iVar20;
  bool bVar21;
  lua_Integer k;
  TValue aux;
  Value local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Value local_40;
  undefined1 local_38;
  
  if ((key->tt_ & 0xf) == 0) {
    pcVar15 = "table index is nil";
LAB_00112e7d:
    luaG_runerror(L,pcVar15);
  }
  if (key->tt_ == 0x13) {
    n = (key->value_).n;
    iVar5 = luaV_flttointeger(n,&local_c8.i,F2Ieq);
    if (iVar5 == 0) {
      if (NAN(n)) {
        pcVar15 = "table index is NaN";
        goto LAB_00112e7d;
      }
    }
    else {
      key = (TValue *)&local_40;
      local_40 = local_c8;
      local_38 = 3;
    }
  }
  if ((value->tt_ & 0xf) != 0) {
    pNVar8 = mainpositionTV(t,key);
    if ((((pNVar8->u).tt_ & 0xf) != 0) || (t->lastfree == (Node *)0x0)) {
      if (t->lastfree == (Node *)0x0) {
LAB_00112b1d:
        pNVar19 = (Node *)0x0;
      }
      else {
        pNVar9 = t->lastfree;
        do {
          if (pNVar9 <= t->node) goto LAB_00112b1d;
          pNVar19 = pNVar9 + -1;
          t->lastfree = pNVar19;
          pcVar15 = (char *)((long)pNVar9 + -0xf);
          pNVar9 = pNVar19;
        } while (*pcVar15 != '\0');
      }
      if (pNVar19 == (Node *)0x0) {
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8.gc = (GCObject *)0x0;
        uStack_c0 = 0;
        uVar6 = luaH_realasize(t);
        t->alimit = uVar6;
        t->flags = t->flags & 0x7f;
        lVar12 = 0;
        uVar13 = 1;
        iVar5 = 0;
        uVar18 = 1;
        do {
          uVar14 = uVar18;
          if ((uVar6 < uVar18) && (uVar14 = uVar6, uVar6 < uVar13)) {
            bVar21 = false;
          }
          else {
            iVar17 = 0;
            uVar16 = uVar13;
            if (uVar13 <= uVar14) {
              uVar16 = uVar14 + 1;
              if (uVar14 + 1 < uVar13 + 1) {
                uVar16 = uVar13 + 1;
              }
              uVar13 = uVar13 - 1;
              iVar17 = 0;
              do {
                iVar17 = (iVar17 + 1) - (uint)((t->array[uVar13].tt_ & 0xf) == 0);
                iVar20 = uVar13 - uVar16;
                uVar13 = uVar13 + 1;
              } while (iVar20 != -2);
            }
            piVar1 = (int *)((long)&local_c8 + lVar12 * 4);
            *piVar1 = *piVar1 + iVar17;
            iVar5 = iVar5 + iVar17;
            bVar21 = true;
            uVar13 = uVar16;
          }
          if (!bVar21) break;
          lVar12 = lVar12 + 1;
          uVar18 = uVar18 * 2;
        } while (lVar12 != 0x20);
        lVar12 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) * 0x18 + 0x10;
        iVar20 = 0;
        iVar17 = 0;
        do {
          pNVar9 = t->node;
          if ((*(byte *)((long)pNVar9 + lVar12 + -8) & 0xf) != 0) {
            if (*(char *)((long)pNVar9 + lVar12 + -7) == '\x03') {
              bVar21 = 0xffffffff7fffffff < *(long *)((long)pNVar9 + lVar12) - 0x80000001U;
              if (bVar21) {
                iVar7 = luaO_ceillog2((uint)*(long *)((long)pNVar9 + lVar12));
                piVar1 = (int *)((long)&local_c8 + (long)iVar7 * 4);
                *piVar1 = *piVar1 + 1;
              }
              iVar17 = iVar17 + (uint)bVar21;
            }
            iVar20 = iVar20 + 1;
          }
          lVar12 = lVar12 + -0x18;
        } while (lVar12 != -8);
        uVar18 = iVar17 + iVar5;
        if (((Value *)((long)key + 8))->ub == '\x03') {
          bVar21 = (code *)0xffffffff7fffffff < *(lua_CFunction *)key + -0x80000001;
          if (bVar21) {
            iVar17 = luaO_ceillog2((uint)*(lua_CFunction *)key);
            piVar1 = (int *)((long)&local_c8 + (long)iVar17 * 4);
            *piVar1 = *piVar1 + 1;
          }
          uVar18 = uVar18 + bVar21;
        }
        uVar13 = 1;
        lVar12 = 0;
        uVar14 = 0;
        uVar6 = 0;
        uVar16 = 0;
        do {
          if (uVar18 <= uVar13 >> 1) break;
          uVar16 = uVar16 + *(int *)((long)&local_c8 + lVar12 * 4);
          if (uVar13 >> 1 < uVar16) {
            uVar6 = uVar16;
            uVar14 = uVar13;
          }
          lVar12 = lVar12 + 1;
          uVar13 = uVar13 * 2;
        } while (lVar12 != 0x20);
        luaH_resize(L,t,uVar14,((iVar5 + iVar20) - uVar6) + 1);
        pTVar11 = luaH_get(t,key);
        if (pTVar11->tt_ == ' ') {
          luaH_newkey(L,t,key,value);
        }
        else {
          pTVar11->value_ = value->value_;
          pTVar11->tt_ = value->tt_;
        }
      }
      else {
        local_c8 = (pNVar8->u).key_val;
        uStack_c0 = CONCAT71(uStack_c0._1_7_,(pNVar8->u).key_tt);
        pNVar9 = mainpositionTV(t,(TValue *)&local_c8);
        if (pNVar9 == pNVar8) {
          if ((long)(pNVar8->u).next != 0) {
            (pNVar19->u).next =
                 (int)((ulong)((long)pNVar8 + ((long)(pNVar8->u).next * 0x18 - (long)pNVar19)) >> 3)
                 * -0x55555555;
          }
          (pNVar8->u).next = (int)((ulong)((long)pNVar19 - (long)pNVar8) >> 3) * -0x55555555;
          pNVar8 = pNVar19;
        }
        else {
          do {
            pNVar10 = pNVar9;
            pNVar9 = pNVar10 + (pNVar10->u).next;
          } while (pNVar10 + (pNVar10->u).next != pNVar8);
          (pNVar10->u).next = (int)((ulong)((long)pNVar19 - (long)pNVar10) >> 3) * -0x55555555;
          (pNVar19->u).key_val = (pNVar8->u).key_val;
          lVar2 = *(lu_byte *)((long)pNVar8 + 8);
          lVar3 = *(lu_byte *)((long)pNVar8 + 9);
          uVar4 = *(undefined2 *)((long)pNVar8 + 10);
          iVar5 = *(int *)((long)pNVar8 + 0xc);
          (pNVar19->u).value_ = (pNVar8->u).value_;
          *(lu_byte *)((long)pNVar19 + 8) = lVar2;
          *(lu_byte *)((long)pNVar19 + 9) = lVar3;
          *(undefined2 *)((long)pNVar19 + 10) = uVar4;
          *(int *)((long)pNVar19 + 0xc) = iVar5;
          if ((pNVar8->u).next != 0) {
            (pNVar19->u).next =
                 (pNVar19->u).next + (int)((ulong)((long)pNVar8 - (long)pNVar19) >> 3) * -0x55555555
            ;
            (pNVar8->u).next = 0;
          }
          (pNVar8->u).tt_ = '\x10';
        }
      }
      if (pNVar19 == (Node *)0x0) {
        return;
      }
    }
    (pNVar8->u).key_val.f = (lua_CFunction)key->value_;
    (pNVar8->u).key_tt = ((Value *)((long)key + 8))->ub;
    if ((((((Value *)((long)key + 8))->ub & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
       (((*(GCObject **)key)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(GCObject *)t);
    }
    (pNVar8->u).value_ = value->value_;
    (pNVar8->u).tt_ = value->tt_;
  }
  return;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  Node *mp;
  TValue aux;
  if (l_unlikely(ttisnil(key)))
    luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Number f = fltvalue(key);
    lua_Integer k;
    if (luaV_flttointeger(f, &k, F2Ieq)) {  /* does key fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (l_unlikely(luai_numisnan(f)))
      luaG_runerror(L, "table index is NaN");
  }
  if (ttisnil(value))
    return;  /* do not insert nil values */
  mp = mainpositionTV(t, key);
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      luaH_set(L, t, key, value);  /* insert key into grown table */
      return;
    }
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, mp, key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(isempty(gval(mp)));
  setobj2t(L, gval(mp), value);
}